

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O0

void __thiscall
test::string_assertion_test::iu_StrCaseTest_x_iutest_x_CaseEqString_Test<wchar_t>::
iu_StrCaseTest_x_iutest_x_CaseEqString_Test
          (iu_StrCaseTest_x_iutest_x_CaseEqString_Test<wchar_t> *this)

{
  iu_StrCaseTest_x_iutest_x_CaseEqString_Test<wchar_t> *this_local;
  
  StrCaseTest<wchar_t>::StrCaseTest(&this->super_StrCaseTest<wchar_t>);
  (this->super_StrCaseTest<wchar_t>).super_StrTest<wchar_t>.super_Test._vptr_Test =
       (_func_int **)&PTR__iu_StrCaseTest_x_iutest_x_CaseEqString_Test_00626e58;
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, CaseEqString)
{
    typename TestFixture::String test = TestFixture::Text::test;
    typename TestFixture::String Test = TestFixture::Text::Test;
    IUTEST_INFORM_STRCASEEQ(Test, TestFixture::Text::test);
    IUTEST_INFORM_STRCASEEQ(Test, test);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::test, Test);

    IUTEST_EXPECT_STRCASEEQ(Test, TestFixture::Text::test);
    IUTEST_EXPECT_STRCASEEQ(Test, test);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::test, Test);

    IUTEST_ASSERT_STRCASEEQ(Test, TestFixture::Text::test);
    IUTEST_ASSERT_STRCASEEQ(Test, test);
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::test, Test);
}